

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

bool __thiscall QDockAreaLayoutItem::expansive(QDockAreaLayoutItem *this,Orientation o)

{
  long lVar1;
  QDockAreaLayoutInfo *in_RDI;
  long in_FS_OFFSET;
  Orientation in_stack_ffffffffffffffcc;
  Orientation in_stack_ffffffffffffffd0;
  Orientation in_stack_ffffffffffffffd4;
  QFlagsStorage<Qt::Orientation> lhs;
  bool local_d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_RDI->dockPos & RightDock) == LeftDock) &&
     ((in_RDI->separatorWidgets).d.ptr == (QWidget **)0x0)) {
    if (in_RDI->sep == (int *)0x0) {
      if ((in_RDI->separatorWidgets).d.d == (Data *)0x0) {
        local_d = false;
      }
      else {
        local_d = QDockAreaLayoutInfo::expansive(in_RDI,in_stack_ffffffffffffffd4);
      }
    }
    else {
      (**(code **)(*(long *)in_RDI->sep + 0x28))();
      lhs.i = (Int)((ulong)in_RDI >> 0x20);
      QFlags<Qt::Orientation>::operator&
                ((QFlags<Qt::Orientation> *)
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc);
      local_d = ::operator==((QFlags<Qt::Orientation>)lhs.i,in_stack_ffffffffffffffd0);
    }
  }
  else {
    local_d = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_d;
  }
  __stack_chk_fail();
}

Assistant:

bool QDockAreaLayoutItem::expansive(Qt::Orientation o) const
{
    if ((flags & GapItem) || placeHolderItem != nullptr)
        return false;
    if (widgetItem != nullptr)
        return ((widgetItem->expandingDirections() & o) == o);
    if (subinfo != nullptr)
        return subinfo->expansive(o);
    return false;
}